

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrtrns.cpp
# Opt level: O0

UChar * u_strFromUTF32WithSub_63
                  (UChar *dest,int32_t destCapacity,int32_t *pDestLength,UChar32 *src,
                  int32_t srcLength,UChar32 subchar,int32_t *pNumSubstitutions,
                  UErrorCode *pErrorCode)

{
  uint uVar1;
  UBool UVar2;
  uint *puVar3;
  uint *local_78;
  bool local_6b;
  UChar *local_68;
  int32_t local_60;
  int local_5c;
  int32_t numSubstitutions;
  int32_t reqLength;
  UChar *pDest;
  UChar *destLimit;
  uint *puStack_40;
  UChar32 ch;
  UChar32 *srcLimit;
  UChar32 subchar_local;
  int32_t srcLength_local;
  UChar32 *src_local;
  int32_t *pDestLength_local;
  int32_t destCapacity_local;
  UChar *dest_local;
  
  UVar2 = U_FAILURE(*pErrorCode);
  if (UVar2 == '\0') {
    if (((((src == (UChar32 *)0x0) && (srcLength != 0)) || (srcLength < -1)) || (destCapacity < 0))
       || (((dest == (UChar *)0x0 && (0 < destCapacity)) ||
           ((0x10ffff < subchar || ((subchar & 0xfffff800U) == 0xd800)))))) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
      dest_local = (UChar *)0x0;
    }
    else {
      if (pNumSubstitutions != (int32_t *)0x0) {
        *pNumSubstitutions = 0;
      }
      if (dest == (UChar *)0x0) {
        local_68 = (UChar *)0x0;
      }
      else {
        local_68 = dest + destCapacity;
      }
      local_5c = 0;
      local_60 = 0;
      _numSubstitutions = dest;
      _subchar_local = (uint *)src;
      if (srcLength < 0) {
        while( true ) {
          uVar1 = *_subchar_local;
          local_6b = false;
          if ((uVar1 != 0) && (local_6b = true, 0xd7ff < uVar1)) {
            local_6b = 0xdfff < (int)uVar1 && (int)uVar1 < 0x10000;
          }
          puStack_40 = _subchar_local;
          if (!local_6b) break;
          _subchar_local = _subchar_local + 1;
          if (_numSubstitutions < local_68) {
            *_numSubstitutions = (UChar)uVar1;
            _numSubstitutions = _numSubstitutions + 1;
          }
          else {
            local_5c = local_5c + 1;
          }
        }
        while (uVar1 != 0) {
          uVar1 = puStack_40[1];
          puStack_40 = puStack_40 + 1;
        }
      }
      else {
        if (src == (UChar32 *)0x0) {
          local_78 = (uint *)0x0;
        }
        else {
          local_78 = (uint *)(src + srcLength);
        }
        puStack_40 = local_78;
        _numSubstitutions = dest;
        _subchar_local = (uint *)src;
      }
LAB_003b461f:
      if (_subchar_local < puStack_40) {
        puVar3 = _subchar_local + 1;
        destLimit._4_4_ = *_subchar_local;
        while ((_subchar_local = puVar3, 0xd7ff < destLimit._4_4_ &&
               (((int)destLimit._4_4_ < 0xe000 || (0xffff < (int)destLimit._4_4_))))) {
          if ((0xffff < (int)destLimit._4_4_) && ((int)destLimit._4_4_ < 0x110000)) {
            if ((_numSubstitutions == (UChar *)0x0) || (local_68 < _numSubstitutions + 2)) {
              local_5c = local_5c + 2;
            }
            else {
              *_numSubstitutions = (short)((int)destLimit._4_4_ >> 10) + L'ퟀ';
              _numSubstitutions[1] = (UChar)destLimit._4_4_ & 0x3ffU | 0xdc00;
              _numSubstitutions = _numSubstitutions + 2;
            }
            goto LAB_003b461f;
          }
          if (subchar < 0) {
            *pErrorCode = U_INVALID_CHAR_FOUND;
            return (UChar *)0x0;
          }
          local_60 = local_60 + 1;
          destLimit._4_4_ = subchar;
        }
        if (_numSubstitutions < local_68) {
          *_numSubstitutions = (UChar)destLimit._4_4_;
          _numSubstitutions = _numSubstitutions + 1;
        }
        else {
          local_5c = local_5c + 1;
        }
        goto LAB_003b461f;
      }
      local_5c = (int)((long)_numSubstitutions - (long)dest >> 1) + local_5c;
      if (pDestLength != (int32_t *)0x0) {
        *pDestLength = local_5c;
      }
      if (pNumSubstitutions != (int32_t *)0x0) {
        *pNumSubstitutions = local_60;
      }
      u_terminateUChars_63(dest,destCapacity,local_5c,pErrorCode);
      dest_local = dest;
    }
  }
  else {
    dest_local = (UChar *)0x0;
  }
  return dest_local;
}

Assistant:

U_CAPI UChar* U_EXPORT2 
u_strFromUTF32WithSub(UChar *dest,
               int32_t destCapacity,
               int32_t *pDestLength,
               const UChar32 *src,
               int32_t srcLength,
               UChar32 subchar, int32_t *pNumSubstitutions,
               UErrorCode *pErrorCode) {
    const UChar32 *srcLimit;
    UChar32 ch;
    UChar *destLimit;
    UChar *pDest;
    int32_t reqLength;
    int32_t numSubstitutions;

    /* args check */
    if(U_FAILURE(*pErrorCode)){
        return NULL;
    }
    if( (src==NULL && srcLength!=0) || srcLength < -1 ||
        (destCapacity<0) || (dest == NULL && destCapacity > 0) ||
        subchar > 0x10ffff || U_IS_SURROGATE(subchar)
    ) {
        *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }

    if(pNumSubstitutions != NULL) {
        *pNumSubstitutions = 0;
    }

    pDest = dest;
    destLimit = (dest!=NULL)?(dest + destCapacity):NULL;
    reqLength = 0;
    numSubstitutions = 0;

    if(srcLength < 0) {
        /* simple loop for conversion of a NUL-terminated BMP string */
        while((ch=*src) != 0 &&
              ((uint32_t)ch < 0xd800 || (0xe000 <= ch && ch <= 0xffff))) {
            ++src;
            if(pDest < destLimit) {
                *pDest++ = (UChar)ch;
            } else {
                ++reqLength;
            }
        }
        srcLimit = src;
        if(ch != 0) {
            /* "complicated" case, find the end of the remaining string */
            while(*++srcLimit != 0) {}
        }
    } else {
      srcLimit = (src!=NULL)?(src + srcLength):NULL;
    }

    /* convert with length */
    while(src < srcLimit) {
        ch = *src++;
        do {
            /* usually "loops" once; twice only for writing subchar */
            if((uint32_t)ch < 0xd800 || (0xe000 <= ch && ch <= 0xffff)) {
                if(pDest < destLimit) {
                    *pDest++ = (UChar)ch;
                } else {
                    ++reqLength;
                }
                break;
            } else if(0x10000 <= ch && ch <= 0x10ffff) {
                if(pDest!=NULL && ((pDest + 2) <= destLimit)) {
                    *pDest++ = U16_LEAD(ch);
                    *pDest++ = U16_TRAIL(ch);
                } else {
                    reqLength += 2;
                }
                break;
            } else if((ch = subchar) < 0) {
                /* surrogate code point, or not a Unicode code point at all */
                *pErrorCode = U_INVALID_CHAR_FOUND;
                return NULL;
            } else {
                ++numSubstitutions;
            }
        } while(TRUE);
    }

    reqLength += (int32_t)(pDest - dest);
    if(pDestLength) {
        *pDestLength = reqLength;
    }
    if(pNumSubstitutions != NULL) {
        *pNumSubstitutions = numSubstitutions;
    }

    /* Terminate the buffer */
    u_terminateUChars(dest, destCapacity, reqLength, pErrorCode);
    
    return dest;
}